

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram_p.h
# Opt level: O2

void __thiscall QIpPacketHeader::clear(QIpPacketHeader *this)

{
  QHostAddress::clear(&this->senderAddress);
  QHostAddress::clear(&this->destinationAddress);
  this->ifindex = 0;
  this->hopLimit = -1;
  this->streamNumber = -1;
  this->endOfRecord = false;
  return;
}

Assistant:

void clear()
    {
        senderAddress.clear();
        destinationAddress.clear();
        ifindex = 0;
        hopLimit = -1;
        streamNumber = -1;
        endOfRecord = false;
    }